

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# isubd-terrain.cpp
# Opt level: O2

bool loadSubdCsLodProgram(void)

{
  bool bVar1;
  GLenum GVar2;
  djg_program *djp;
  char buf [1024];
  
  if (g_terrain.method == 2) {
    djp = djgp_create();
    fwrite("Loading {Compute-LoD-Program}\n",0x1e,1,_stdout);
    fflush(_stdout);
    setShaderMacros(djp);
    strcat2(buf,g_app.dir.shader,"fcull.glsl");
    djgp_push_file(djp,buf);
    strcat2(buf,g_app.dir.shader,"isubd.glsl");
    djgp_push_file(djp,buf);
    strcat2(buf,g_app.dir.shader,"terrain_common.glsl");
    djgp_push_file(djp,buf);
    strcat2(buf,g_app.dir.shader,"terrain_cs_lod.glsl");
    djgp_push_file(djp,buf);
    bVar1 = djgp_to_gl(djp,0x1c2,false,true,g_gl.programs + 1);
    if (!bVar1) {
      fwrite("=> Failure <=\n",0xe,1,_stdout);
      fflush(_stdout);
      djgp_release(djp);
      return false;
    }
    djgp_release(djp);
    g_gl.uniforms[5] = (*glad_glGetUniformLocation)(g_gl.programs[1],"u_DmapFactor");
    g_gl.uniforms[4] = (*glad_glGetUniformLocation)(g_gl.programs[1],"u_DmapSampler");
    g_gl.uniforms[6] = (*glad_glGetUniformLocation)(g_gl.programs[1],"u_LodFactor");
    configureSubdCsLodProgram();
  }
  GVar2 = (*glad_glGetError)();
  return GVar2 == 0;
}

Assistant:

bool loadSubdCsLodProgram()
{
    if (g_terrain.method == METHOD_CS) {
        djg_program *djp = djgp_create();
        GLuint *program = &g_gl.programs[PROGRAM_SUBD_CS_LOD];
        char buf[1024];

        LOG("Loading {Compute-LoD-Program}\n");
        setShaderMacros(djp);
        djgp_push_file(djp, strcat2(buf, g_app.dir.shader, "fcull.glsl"));
        djgp_push_file(djp, strcat2(buf, g_app.dir.shader, "isubd.glsl"));
        djgp_push_file(djp, strcat2(buf, g_app.dir.shader, "terrain_common.glsl"));

        djgp_push_file(djp, strcat2(buf, g_app.dir.shader, "terrain_cs_lod.glsl"));

        if (!djgp_to_gl(djp, 450, false, true, program)) {
            LOG("=> Failure <=\n");
            djgp_release(djp);

            return false;
        }
        djgp_release(djp);

        g_gl.uniforms[UNIFORM_SUBD_CS_LOD_DMAP_FACTOR] =
            glGetUniformLocation(g_gl.programs[PROGRAM_SUBD_CS_LOD], "u_DmapFactor");
        g_gl.uniforms[UNIFORM_SUBD_CS_LOD_DMAP_SAMPLER] =
            glGetUniformLocation(g_gl.programs[PROGRAM_SUBD_CS_LOD], "u_DmapSampler");
        g_gl.uniforms[UNIFORM_SUBD_CS_LOD_LOD_FACTOR] =
            glGetUniformLocation(g_gl.programs[PROGRAM_SUBD_CS_LOD], "u_LodFactor");

        configureSubdCsLodProgram();
    }

    return (glGetError() == GL_NO_ERROR);
}